

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain_pdf2(Impl *this,Value *pnext,void **outpNext)

{
  VkStructureType VVar1;
  bool bVar2;
  bool bVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  VkPhysicalDeviceMeshShaderFeaturesEXT *pVVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums;
  VkPhysicalDeviceMeshShaderFeaturesEXT *local_58;
  Impl *local_50;
  VkPhysicalDeviceMeshShaderFeaturesEXT *local_48;
  void **local_40;
  int *local_38;
  
  local_50 = this;
  if ((pnext->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(pnext->data_).s.str & 0xffffffffffff);
  local_40 = outpNext;
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(pnext);
  bVar7 = pGVar4 == this_00;
  if (bVar7) {
    local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
  }
  else {
    local_38 = (int *)(*in_FS_OFFSET + -0x18);
    local_48 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
    pVVar6 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"sType");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x20000000000000)
          == (undefined1  [16])0x0) {
        __assert_fail("data_.f.flags & kIntFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x718,
                      "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      VVar1 = (pGVar5->data_).s.length;
      if ((int)VVar1 < 0x3b9fcb40) {
        if (0x3b9f272f < (int)VVar1) {
          if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
            local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_robustness2_features
                      (local_50,(Value *)this_00,
                       (VkPhysicalDeviceRobustness2FeaturesEXT **)&local_58);
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
            local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_descriptor_buffer_features
                      (local_50,(Value *)this_00,
                       (VkPhysicalDeviceDescriptorBufferFeaturesEXT **)&local_58);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV)
            goto LAB_001173f6;
            local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_fragment_shading_rate_enums_features
                      (local_50,(Value *)this_00,
                       (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **)&local_58);
          }
          goto LAB_001173af;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
          local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_mesh_shader_features_nv
                    (local_50,(Value *)this_00,(VkPhysicalDeviceMeshShaderFeaturesNV **)&local_58);
          goto LAB_001173af;
        }
        if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
          local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_fragment_shading_rate_features
                    (local_50,(Value *)this_00,
                     (VkPhysicalDeviceFragmentShadingRateFeaturesKHR **)&local_58);
          goto LAB_001173af;
        }
LAB_001173f6:
        if (*local_38 < 3) {
          bVar2 = false;
          bVar3 = Internal::log_thread_callback
                            (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",(ulong)VVar1);
          if (!bVar3) {
            bVar2 = false;
            fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                    (ulong)VVar1);
          }
        }
        else {
          bVar2 = false;
        }
      }
      else {
        if ((int)VVar1 < 0x3ba09e30) {
          if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
            local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_mesh_shader_features(local_50,(Value *)this_00,&local_58);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES)
            goto LAB_001173f6;
            local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
            parse_image_robustness_features
                      (local_50,(Value *)this_00,
                       (VkPhysicalDeviceImageRobustnessFeaturesEXT **)&local_58);
          }
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT)
        {
          local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_primitives_generated_query_features
                    (local_50,(Value *)this_00,
                     (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **)&local_58);
        }
        else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
          local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_2d_view_of_3d_features
                    (local_50,(Value *)this_00,
                     (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **)&local_58);
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT)
          goto LAB_001173f6;
          local_58 = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
          parse_shader_object_features
                    (local_50,(Value *)this_00,(VkPhysicalDeviceShaderObjectFeaturesEXT **)&local_58
                    );
        }
LAB_001173af:
        local_58->sType = VVar1;
        local_58->pNext = (void *)0x0;
        bVar2 = true;
        if (pVVar6 == (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0) {
          local_48 = local_58;
          pVVar6 = local_58;
        }
        else {
          pVVar6->pNext = local_58;
          pVVar6 = local_58;
        }
      }
      if (!bVar2) break;
      this_00 = this_00 + 0x10;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pnext);
      bVar7 = this_00 == pGVar4;
    } while (!bVar7);
  }
  if (bVar7 != false) {
    *local_40 = local_48;
  }
  return bVar7;
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain_pdf2(const Value &pnext, void **outpNext)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			VkPhysicalDeviceRobustness2FeaturesEXT *robustness2 = nullptr;
			if (!parse_robustness2_features(next, &robustness2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(robustness2);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			VkPhysicalDeviceImageRobustnessFeaturesEXT *image_robustness = nullptr;
			if (!parse_image_robustness_features(next, &image_robustness))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(image_robustness);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums = nullptr;
			if (!parse_fragment_shading_rate_enums_features(next, &fragment_shading_rate_enums))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate_enums);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate_features(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader = nullptr;
			if (!parse_mesh_shader_features(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader = nullptr;
			if (!parse_mesh_shader_features_nv(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer = nullptr;
			if (!parse_descriptor_buffer_features(next, &descriptor_buffer))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(descriptor_buffer);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object = nullptr;
			if (!parse_shader_object_features(next, &shader_object))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(shader_object);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated = nullptr;
			if (!parse_primitives_generated_query_features(next, &prim_generated))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(prim_generated);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *view_2d_of_3d = nullptr;
			if (!parse_2d_view_of_3d_features(next, &view_2d_of_3d))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(view_2d_of_3d);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}